

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:2092:13),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:2092:13),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  String *pSVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  Exception *this_00;
  StringPtr expected;
  ExceptionOr<kj::_::Void> depResult;
  ExceptionOr<kj::Promise<void>_> local_5c8;
  ExceptionOrValue local_450;
  char local_2f0;
  Exception local_2e8;
  Exception local_188;
  
  local_450.exception.ptr.isSet = false;
  local_2f0 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_450);
  uVar6 = local_450.exception.ptr.field_1.value.context.ptr.ptr;
  uVar5 = local_450.exception.ptr.field_1.value.description.content.size_;
  uVar4 = local_450.exception.ptr.field_1.value.description.content.ptr;
  uVar3 = local_450.exception.ptr.field_1.value.ownFile.content.size_;
  uVar2 = local_450.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_450.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_450.exception.ptr.field_1 + 0x50);
    local_188.ownFile.content.disposer =
         local_450.exception.ptr.field_1.value.ownFile.content.disposer;
    local_450.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_450.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_188.file = local_450.exception.ptr.field_1.value.file;
    local_188.line = local_450.exception.ptr.field_1.value.line;
    local_188.type = local_450.exception.ptr.field_1.value.type;
    local_188.description.content.disposer =
         local_450.exception.ptr.field_1.value.description.content.disposer;
    local_450.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_450.exception.ptr.field_1.value.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_450.exception.ptr.field_1.value.context.ptr.disposer;
    local_450.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_2e8.ownFile.content.disposer =
         local_450.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_2e8.file = local_450.exception.ptr.field_1.value.file;
    local_2e8.line = local_450.exception.ptr.field_1.value.line;
    local_2e8.type = local_450.exception.ptr.field_1.value.type;
    local_2e8.description.content.disposer =
         local_450.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_2e8.context.ptr.disposer = local_450.exception.ptr.field_1.value.context.ptr.disposer;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2e8.trace,__src,0x104);
    local_5c8.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar2
    ;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = uVar3;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_450.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2e8.ownFile.content.ptr = (char *)0x0;
    local_2e8.ownFile.content.size_ = 0;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_450.exception.ptr.field_1.value.file;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_450.exception.ptr.field_1._32_8_;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)uVar4;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = uVar5;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_450.exception.ptr.field_1.value.description.content.disposer;
    local_2e8.description.content.ptr = (char *)0x0;
    local_2e8.description.content.size_ = 0;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_450.exception.ptr.field_1.value.context.ptr.disposer;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar6;
    local_2e8.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_5c8.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),__src,
           0x104);
    local_5c8.value.ptr.isSet = false;
    Exception::~Exception(&local_2e8);
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_5c8)
    ;
    uVar2 = local_5c8.value.ptr.field_1.value.super_PromiseBase.node.ptr;
    if ((local_5c8.value.ptr.isSet == true) &&
       (local_5c8.value.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
      local_5c8.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_5c8.value.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_5c8.value.ptr.field_1.value.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)uVar2)->_vptr_PromiseNode +
                 (long)((PromiseNode *)uVar2)->_vptr_PromiseNode[-2]));
    }
    if (local_5c8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    this_00 = &local_188;
  }
  else {
    if (local_2f0 != '\x01') goto LAB_00284928;
    pSVar1 = (this->func).request;
    if ((pSVar1->content).size_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pSVar1->content).ptr;
    }
    expected.content.size_ = (size_t)pcVar7;
    expected.content.ptr = (char *)((this->func).pipe)->ends[1].ptr;
    kj::anon_unknown_0::expectRead((AsyncInputStream *)&local_2e8,expected);
    local_5c8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_5c8.value.ptr.isSet = true;
    local_5c8.value.ptr.field_1.value.super_PromiseBase.node.disposer =
         (Disposer *)local_2e8.ownFile.content.ptr;
    local_5c8.value.ptr.field_1.value.super_PromiseBase.node.ptr =
         (PromiseNode *)local_2e8.ownFile.content.size_;
    local_2e8.ownFile.content.size_ = 0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_5c8)
    ;
    uVar2 = local_5c8.value.ptr.field_1.value.super_PromiseBase.node.ptr;
    if ((local_5c8.value.ptr.isSet == true) &&
       (local_5c8.value.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
      local_5c8.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_5c8.value.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_5c8.value.ptr.field_1.value.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)uVar2)->_vptr_PromiseNode +
                 (long)((PromiseNode *)uVar2)->_vptr_PromiseNode[-2]));
    }
    if (local_5c8.super_ExceptionOrValue.exception.ptr.isSet != true) goto LAB_00284928;
    this_00 = (Exception *)&local_5c8.super_ExceptionOrValue.exception.ptr.field_1;
  }
  Exception::~Exception(this_00);
LAB_00284928:
  if (local_450.exception.ptr.isSet == true) {
    Exception::~Exception(&local_450.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }